

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O1

Bitmap * __thiscall lunasvg::Bitmap::operator=(Bitmap *this,Bitmap *bitmap)

{
  plutovg_surface_t *ppVar1;
  plutovg_surface_t *surface;
  plutovg_surface *__tmp;
  
  ppVar1 = bitmap->m_surface;
  bitmap->m_surface = (plutovg_surface_t *)0x0;
  surface = this->m_surface;
  this->m_surface = ppVar1;
  plutovg_surface_destroy(surface);
  return this;
}

Assistant:

Bitmap& Bitmap::operator=(Bitmap&& bitmap)
{
    Bitmap(std::move(bitmap)).swap(*this);
    return *this;
}